

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::
~ExceptionOr(ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> *this)

{
  ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> *this_local;
  
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;